

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall Assimp::StreamWriter<false,_false>::Flush(StreamWriter<false,_false> *this)

{
  element_type *peVar1;
  uchar *puVar2;
  size_type sVar3;
  StreamWriter<false,_false> *this_local;
  
  peVar1 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
  (*peVar1->_vptr_IOStream[3])(peVar1,puVar2,1,sVar3);
  peVar1 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar1->_vptr_IOStream[7])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->buffer);
  this->cursor = 0;
  return;
}

Assistant:

void Flush()
    {
        stream->Write(buffer.data(), 1, buffer.size());
        stream->Flush();
        buffer.clear();
        cursor = 0;
    }